

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O3

int resolve_symbolnames(dl_phdr_info *info,size_t info_size,void *data)

{
  uint uVar1;
  uint8_t header;
  uint uVar2;
  lj_wbuf *buf;
  lua_State *L;
  Elf64_Addr EVar3;
  size_t sVar4;
  unsigned_long_long uVar5;
  int iVar6;
  int iVar7;
  Elf64_Addr EVar8;
  ssize_t sVar9;
  FILE *__stream;
  size_t sVar10;
  void *__ptr;
  uint *puVar11;
  size_t sVar12;
  ulong *puVar13;
  ulong uVar14;
  Elf64_Sym *pEVar15;
  size_t sVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  char *pcVar22;
  long *plVar23;
  long lVar24;
  uint uVar25;
  char executable_path [4096];
  char *local_10b8;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  long lStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  char local_1038 [4104];
  
  buf = *data;
  L = *(lua_State **)((long)data + 8);
  header = *(uint8_t *)((long)data + 0x10);
  memset(local_1038,0,0x1000);
  uVar5 = info->dlpi_adds;
  iVar6 = **(int **)((long)data + 0x20);
  EVar3 = info->dlpi_addr;
  EVar8 = getauxval(0x21);
  if (EVar3 == EVar8) {
    return 0;
  }
  iVar7 = (int)info->dlpi_adds;
  iVar21 = iVar7 - **(int **)((long)data + 0x20);
  *(int *)((long)data + 0x18) = iVar21;
  if (iVar21 == 0) {
    return 1;
  }
  uVar19 = *(uint *)((long)data + 0x14);
  uVar25 = (int)uVar5 - (iVar6 + iVar21);
  if (uVar19 < uVar25) goto LAB_0012a6a0;
  if (uVar19 == uVar25 - 1) {
    **(int **)((long)data + 0x20) = iVar7;
  }
  pcVar22 = info->dlpi_name;
  if (*pcVar22 == '\0') {
    pcVar22 = local_1038;
    sVar9 = readlink("/proc/self/exe",pcVar22,0x1000);
    if (sVar9 == -1) {
      pcVar22 = info->dlpi_name;
    }
    else {
      info->dlpi_name = pcVar22;
    }
  }
  EVar3 = info->dlpi_addr;
  local_1048 = 0;
  uStack_1040 = 0;
  local_1058 = 0;
  lStack_1050 = 0;
  local_1068 = 0;
  uStack_1060 = 0;
  local_1078 = 0;
  uStack_1070 = 0;
  __stream = fopen64(pcVar22,"rb");
  if (__stream != (FILE *)0x0) {
    sVar10 = fread(&local_1078,0x40,1,__stream);
    if (((sVar10 == 0x40) || (iVar6 = ferror(__stream), iVar6 == 0)) &&
       (lVar18 = lStack_1050, (int)local_1078 == 0x464c457f)) {
      if (uStack_1040._2_2_ != 0 && (uStack_1040._4_2_ != 0 && lStack_1050 != 0)) {
        uVar20 = (ulong)uStack_1040._4_2_;
        uVar14 = (ulong)uStack_1040._2_2_;
        sVar10 = uVar14 * uVar20;
        __ptr = lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar10);
        if (__ptr != (void *)0x0) {
          iVar7 = fseek(__stream,lVar18,0);
          iVar6 = -1;
          iVar21 = -1;
          if ((iVar7 == 0) &&
             ((sVar12 = fread(__ptr,uVar14,uVar20,__stream), sVar12 == sVar10 ||
              (iVar7 = ferror(__stream), iVar7 == 0)))) {
            puVar13 = (ulong *)((long)__ptr + 0x38);
            do {
              iVar6 = iVar21;
              if (*(int *)((long)puVar13 + -0x34) == 2) {
                uVar20 = puVar13[-4];
                lVar24 = (ulong)(uint)puVar13[-2] * 0x40;
                lVar18 = *(long *)((long)__ptr + lVar24 + 0x18);
                uVar14 = puVar13[-3] / *puVar13;
                if ((*puVar13 <= puVar13[-3] && uVar20 != 0) && lVar18 != 0) {
                  sVar12 = *(size_t *)((long)__ptr + lVar24 + 0x20);
                  sVar4 = uVar14 * 0x18;
                  pEVar15 = (Elf64_Sym *)lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar4);
                  if (pEVar15 != (Elf64_Sym *)0x0) {
                    local_10b8 = (char *)0x0;
                    iVar7 = fseek(__stream,uVar20,0);
                    iVar6 = -1;
                    if (iVar7 == 0) {
                      sVar16 = fread(pEVar15,0x18,uVar14,__stream);
                      if (((sVar16 == sVar4) || (iVar7 = ferror(__stream), iVar7 == 0)) &&
                         (local_10b8 = (char *)lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar12),
                         local_10b8 != (char *)0x0)) {
                        iVar7 = fseek(__stream,lVar18,0);
                        if ((iVar7 == 0) &&
                           ((sVar16 = fread(local_10b8,1,sVar12,__stream), sVar16 == sVar12 ||
                            (iVar7 = ferror(__stream), iVar7 == 0)))) {
                          write_c_symtab(pEVar15,local_10b8,EVar3,uVar14,header,buf);
                          iVar6 = 0;
                        }
                      }
                      else {
                        local_10b8 = (char *)0x0;
                      }
                    }
                    uVar20 = (ulong)(L->glref).ptr32;
                    *(int *)(uVar20 + 0x50) = *(int *)(uVar20 + 0x50) - (GCSize)sVar4;
                    *(long *)(uVar20 + 0x90) = *(long *)(uVar20 + 0x90) + sVar4;
                    (**(code **)(uVar20 + 0x40))(*(undefined8 *)(uVar20 + 0x48),pEVar15,sVar4,0);
                    if (local_10b8 != (char *)0x0) {
                      uVar20 = (ulong)(L->glref).ptr32;
                      *(int *)(uVar20 + 0x50) = *(int *)(uVar20 + 0x50) - (GCSize)sVar12;
                      *(long *)(uVar20 + 0x90) = *(long *)(uVar20 + 0x90) + sVar12;
                      (**(code **)(uVar20 + 0x40))
                                (*(undefined8 *)(uVar20 + 0x48),local_10b8,sVar12,0);
                    }
                  }
                }
                break;
              }
              puVar13 = puVar13 + 8;
              uVar20 = uVar20 - 1;
            } while (uVar20 != 0);
          }
          uVar20 = (ulong)(L->glref).ptr32;
          *(int *)(uVar20 + 0x50) = *(int *)(uVar20 + 0x50) - (GCSize)sVar10;
          *(long *)(uVar20 + 0x90) = *(long *)(uVar20 + 0x90) + sVar10;
          (**(code **)(uVar20 + 0x40))(*(undefined8 *)(uVar20 + 0x48),__ptr,sVar10,0);
          fclose(__stream);
          if (iVar6 == 0) goto LAB_0012a69d;
          goto LAB_0012a5a9;
        }
      }
    }
    fclose(__stream);
  }
LAB_0012a5a9:
  if ((ulong)info->dlpi_phnum != 0) {
    lVar18 = 0;
    do {
      if (*(int *)((long)&info->dlpi_phdr->p_type + lVar18) == 2) {
        plVar23 = (long *)(*(long *)((long)&info->dlpi_phdr->p_vaddr + lVar18) + info->dlpi_addr + 8
                          );
        pEVar15 = (Elf64_Sym *)0x0;
        lVar18 = 0;
        puVar11 = (uint *)0x0;
        pcVar22 = (char *)0x0;
        goto LAB_0012a5f4;
      }
      lVar18 = lVar18 + 0x38;
    } while ((ulong)info->dlpi_phnum * 0x38 - lVar18 != 0);
  }
LAB_0012a674:
  lj_wbuf_addbyte(buf,'\x01');
  lj_wbuf_addu64(buf,info->dlpi_addr);
  lj_wbuf_addstring(buf,info->dlpi_name);
LAB_0012a69d:
  uVar19 = *(uint *)((long)data + 0x14);
LAB_0012a6a0:
  *(uint *)((long)data + 0x14) = uVar19 + 1;
  return 0;
LAB_0012a5f4:
  switch(plVar23[-1]) {
  case 0:
    goto switchD_0012a605_caseD_0;
  case 1:
  case 2:
  case 3:
    break;
  case 4:
    lVar18 = *plVar23;
    break;
  case 5:
    pcVar22 = (char *)*plVar23;
    break;
  case 6:
    pEVar15 = (Elf64_Sym *)*plVar23;
    break;
  default:
    if (plVar23[-1] == 0x6ffffef5) {
      puVar11 = (uint *)*plVar23;
    }
  }
  plVar23 = plVar23 + 2;
  goto LAB_0012a5f4;
switchD_0012a605_caseD_0:
  if (((lVar18 == 0 && puVar11 == (uint *)0x0) || (pcVar22 == (char *)0x0)) ||
     (pEVar15 == (Elf64_Sym *)0x0)) goto LAB_0012a674;
  if (puVar11 == (uint *)0x0) {
    uVar19 = *(uint *)(lVar18 + 4);
  }
  else {
    uVar25 = *puVar11;
    if ((ulong)uVar25 == 0) {
      uVar17 = 0;
    }
    else {
      lVar18 = 0;
      uVar17 = 0;
      do {
        if (uVar17 <= puVar11[(ulong)puVar11[2] * 2 + lVar18 + 4]) {
          uVar17 = puVar11[(ulong)puVar11[2] * 2 + lVar18 + 4];
        }
        lVar18 = lVar18 + 1;
      } while (uVar25 != (uint)lVar18);
    }
    uVar2 = puVar11[1];
    uVar19 = uVar2;
    if (uVar2 <= uVar17) {
      do {
        uVar1 = uVar17 - uVar2;
        uVar17 = uVar17 + 1;
        uVar19 = uVar17;
      } while ((puVar11[(ulong)puVar11[2] * 2 + (ulong)uVar25 + (ulong)uVar1 + 4] & 1) == 0);
    }
  }
  write_c_symtab(pEVar15,pcVar22,info->dlpi_addr,(ulong)uVar19,header,buf);
  goto LAB_0012a69d;
}

Assistant:

static int resolve_symbolnames(struct dl_phdr_info *info, size_t info_size,
			       void *data)
{
  struct symbol_resolver_conf *conf = data;
  struct lj_wbuf *buf = conf->buf;
  lua_State *L = conf->L;
  const uint8_t header = conf->header;
  char executable_path[PATH_MAX] = {0};

  uint32_t lib_cnt = 0;

  /*
  ** Check that dlpi_adds and dlpi_subs fields are available.
  ** Assertion was taken from the GLIBC tests:
  ** https://code.woboq.org/userspace/glibc/elf/tst-dlmodcount.c.html#37
  */
  lj_assertL(info_size > offsetof(struct dl_phdr_info, dlpi_subs)
			 + sizeof(info->dlpi_subs),
	     "bad dlpi_subs");

  lib_cnt = info->dlpi_adds - *conf->lib_adds;

  /* Skip vDSO library. */
  if (info->dlpi_addr == getauxval(AT_SYSINFO_EHDR))
    return 0;

  if ((conf->to_dump_cnt = info->dlpi_adds - *conf->lib_adds) == 0)
    /* No new libraries, stop resolver. */
    return 1;

  if (conf->cur_lib < lib_cnt - conf->to_dump_cnt) {
    /* That lib is already dumped, skip it. */
    ++conf->cur_lib;
    return 0;
  }

  if (conf->cur_lib == lib_cnt - conf->to_dump_cnt - 1)
    /* Last library, update memrpof's lib counter. */
    *conf->lib_adds = info->dlpi_adds;

  /*
  ** The `dl_iterate_phdr` returns an empty string as a name for
  ** the executable from which it was called. It is still possible
  ** to access its dynamic symbol table, but it is vital for
  ** sysprof to obtain the main symbol table for the LuaJIT
  ** executable. To do so, we need a valid path to the executable.
  ** Since there is no way to obtain the path to a running
  ** executable using the C standard library, the only more or
  ** less reliable way to do this is by reading the symbolic link
  ** from `/proc/self/exe`. Most of the UNIX-based systems have
  ** procfs, so it is not a problem.
  ** Such path tweaks relate only for the main way (see below).
  */
  if (*info->dlpi_name == '\0') {
    if (readlink("/proc/self/exe", executable_path, PATH_MAX) != -1)
      info->dlpi_name = executable_path;
    else
      /*
      ** It is impossible for sysprof to work properly without the
      ** LuaJIT's .symtab section present. The assertion below is
      ** unlikely to be triggered on any system supported by
      ** sysprof, unless someone have deleted the LuaJIT binary
      ** right after the start.
      */
      lj_assertL(0, "bad executed binary symtab section");
  }

  /*
  ** Main way: try to open ELF and read SHT_SYMTAB, SHT_STRTAB and SHT_HASH
  ** sections from it.
  */
  if (dump_sht_symtab(info->dlpi_name, buf, L, header, info->dlpi_addr) == 0) {
    ++conf->cur_lib;
  }
  /* First fallback: dump functions only from PT_DYNAMIC segment. */
  else if(dump_dyn_symtab(info, header, buf) == 0) {
    ++conf->cur_lib;
  }
  /*
  ** Last resort: dump ELF size and address to show .so name for its functions
  ** in memprof output.
  */
  else {
    lj_wbuf_addbyte(buf, SYMTAB_CFUNC);
    lj_wbuf_addu64(buf, info->dlpi_addr);
    lj_wbuf_addstring(buf, info->dlpi_name);
    ++conf->cur_lib;
  }

  return 0;
}